

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::SpreadVolatileSemantics::IsTargetUsedByNonVolatileLoadInEntryPoint
          (SpreadVolatileSemantics *this,uint32_t var_id,Instruction *entry_point)

{
  bool bVar1;
  IRContext *this_00;
  anon_class_1_0_00000001 local_81;
  function<bool_(spvtools::opt::Instruction_*)> local_80;
  undefined1 local_60 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  funcs;
  uint32_t entry_function_id;
  Instruction *entry_point_local;
  uint32_t var_id_local;
  SpreadVolatileSemantics *this_local;
  
  funcs._M_h._M_single_bucket._4_4_ = Instruction::GetSingleWordInOperand(entry_point,1);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_60);
  this_00 = Pass::context(&this->super_Pass);
  IRContext::CollectCallTreeFromRoots
            (this_00,funcs._M_h._M_single_bucket._4_4_,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_60);
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::SpreadVolatileSemantics::IsTargetUsedByNonVolatileLoadInEntryPoint(unsigned_int,spvtools::opt::Instruction*)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_80,&local_81);
  bVar1 = VisitLoadsOfPointersToVariableInEntries
                    (this,var_id,&local_80,
                     (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_60);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_80);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_60);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool SpreadVolatileSemantics::IsTargetUsedByNonVolatileLoadInEntryPoint(
    uint32_t var_id, Instruction* entry_point) {
  uint32_t entry_function_id =
      entry_point->GetSingleWordInOperand(kOpEntryPointInOperandEntryPoint);
  std::unordered_set<uint32_t> funcs;
  context()->CollectCallTreeFromRoots(entry_function_id, &funcs);
  return !VisitLoadsOfPointersToVariableInEntries(
      var_id,
      [](Instruction* load) {
        // If it has a load without volatile memory operand, finish traversal
        // and return false.
        if (load->NumInOperands() <= kOpLoadInOperandMemoryOperands) {
          return false;
        }
        uint32_t memory_operands =
            load->GetSingleWordInOperand(kOpLoadInOperandMemoryOperands);
        return (memory_operands & uint32_t(spv::MemoryAccessMask::Volatile)) !=
               0;
      },
      funcs);
}